

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcStyleModel::~IfcStyleModel(IfcStyleModel *this)

{
  ~IfcStyleModel((IfcStyleModel *)
                 ((long)&(this->super_IfcRepresentation).
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                         _vptr_ObjectHelper +
                 (long)(this->super_IfcRepresentation).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                       _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcStyleModel() : Object("IfcStyleModel") {}